

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_9d72de::CheckLinkLibraryPattern
          (anon_unknown_dwarf_9d72de *this,string_view property,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *value,cmake *context)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  string *s;
  string_view property_local;
  string local_f0;
  string local_d0;
  cmAlphaNum local_b0;
  string local_80;
  cmAlphaNum local_60;
  
  property_local._M_str = (char *)property._M_len;
  property_local._M_len = (size_t)this;
  if ((anonymous_namespace)::
      CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
      ::linkPattern == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
                                 ::linkPattern);
    if (iVar3 != 0) {
      cmsys::RegularExpression::RegularExpression
                (&CheckLinkLibraryPattern::linkPattern,"(^|;)(</?LINK_(LIBRARY|GROUP):[^;>]*>)(;|$)"
                );
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &CheckLinkLibraryPattern::linkPattern,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           CheckLinkLibraryPattern(std::basic_string_view<char,std::char_traits<char>>,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>const&,cmake*)
                           ::linkPattern);
    }
  }
  psVar1 = *(string **)(property._M_str + 8);
  bVar4 = true;
  for (s = *(string **)property._M_str; s != psVar1; s = (string *)&s[1].field_2) {
    bVar2 = cmsys::RegularExpression::find(&CheckLinkLibraryPattern::linkPattern,s);
    if (bVar2) {
      local_b0.View_._M_len = 9;
      local_b0.View_._M_str = "Property ";
      local_60.View_._M_len = property_local._M_len;
      local_60.View_._M_str = property_local._M_str;
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_d0,&CheckLinkLibraryPattern::linkPattern.regmatch,2);
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_f0,&CheckLinkLibraryPattern::linkPattern.regmatch,3);
      cmStrCat<char[29],std::__cxx11::string,char[8],std::basic_string_view<char,std::char_traits<char>>,char[56],std::__cxx11::string,char[66]>
                (&local_80,&local_b0,&local_60,(char (*) [29])" contains the invalid item \"",
                 &local_d0,(char (*) [8])"\". The ",&property_local,
                 (char (*) [56])" property may contain the generator-expression \"$<LINK_",&local_f0
                 ,(char (*) [66])
                  ":...>\" which may be used to specify how the libraries are linked.");
      cmake::IssueMessage((cmake *)value,FATAL_ERROR,&local_80,(cmListFileBacktrace *)(s + 1));
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool CheckLinkLibraryPattern(cm::string_view property,
                             const std::vector<BT<std::string>>& value,
                             cmake* context)
{
  // Look for <LINK_LIBRARY:> and </LINK_LIBRARY:> internal tags
  static cmsys::RegularExpression linkPattern(
    "(^|;)(</?LINK_(LIBRARY|GROUP):[^;>]*>)(;|$)");

  bool isValid = true;

  for (const auto& item : value) {
    if (!linkPattern.find(item.Value)) {
      continue;
    }

    isValid = false;

    // Report an error.
    context->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Property ", property, " contains the invalid item \"",
        linkPattern.match(2), "\". The ", property,
        " property may contain the generator-expression \"$<LINK_",
        linkPattern.match(3),
        ":...>\" which may be used to specify how the libraries are linked."),
      item.Backtrace);
  }

  return isValid;
}